

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.cpp
# Opt level: O2

int __thiscall yyFlexLexer::LexerInput(yyFlexLexer *this,char *buf,int max_size)

{
  int iVar1;
  
  iVar1 = 0;
  if (((&this->field_0x50)[*(long *)(*(long *)&this->yyin + -0x18)] & 7) == 0) {
    std::istream::read((char *)&this->yyin,(long)buf);
    if (((&this->field_0x50)[*(long *)(*(long *)&this->yyin + -0x18)] & 1) == 0) {
      iVar1 = *(int *)&this->field_0x38;
    }
    else {
      iVar1 = -1;
    }
  }
  return iVar1;
}

Assistant:

int yyFlexLexer::LexerInput( char* buf, int max_size )
#endif
{
	if ( yyin.eof() || yyin.fail() )
		return 0;

#ifdef YY_INTERACTIVE
	yyin.get( buf[0] );

	if ( yyin.eof() )
		return 0;

	if ( yyin.bad() )
		return -1;

	return 1;

#else
	(void) yyin.read( buf, max_size );

	if ( yyin.bad() )
		return -1;
	else
		return yyin.gcount();
#endif
}